

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferTextureBufferRange.cpp
# Opt level: O3

string * __thiscall
glcts::TextureBufferTextureBufferRange::getComputeShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,TextureBufferTextureBufferRange *this,FormatInfo *info)

{
  pointer pcVar1;
  int iVar2;
  long *plVar3;
  size_t sVar4;
  stringstream result;
  long *local_238 [2];
  long local_228 [2];
  long *local_218 [2];
  long local_208 [2];
  long *local_1f8 [2];
  long local_1e8 [2];
  long *local_1d8 [2];
  long local_1c8 [2];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "${VERSION}\n\n${TEXTURE_BUFFER_REQUIRE}\n\nprecision highp float;\n\nlayout(",0x46);
  pcVar1 = (info->m_image_format_name)._M_dataplus._M_p;
  local_1d8[0] = local_1c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1d8,pcVar1,pcVar1 + (info->m_image_format_name)._M_string_length);
  plVar3 = local_1d8[0];
  iVar2 = (int)(ostream *)local_1a8;
  if (local_1d8[0] == (long *)0x0) {
    std::ios::clear(iVar2 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
  }
  else {
    sVar4 = strlen((char *)local_1d8[0]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)plVar3,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,", binding = 0) uniform highp readonly ",0x26);
  local_238[0] = local_228;
  pcVar1 = (info->m_image_type_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_238,pcVar1,pcVar1 + (info->m_image_type_name)._M_string_length);
  plVar3 = local_238[0];
  if (local_238[0] == (long *)0x0) {
    std::ios::clear(iVar2 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
  }
  else {
    sVar4 = strlen((char *)local_238[0]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)plVar3,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             " image_buffer;\n\nlayout(binding = 0 ) buffer ComputeSSBOSize\n{\n    int outImageSize;\n} computeSSBOSize;\nlayout(binding = 1 ) buffer ComputeSSBOSizeValue\n{\n    "
             ,0x9e);
  pcVar1 = (info->m_output_type_name)._M_dataplus._M_p;
  local_1f8[0] = local_1e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1f8,pcVar1,pcVar1 + (info->m_output_type_name)._M_string_length);
  plVar3 = local_1f8[0];
  if (local_1f8[0] == (long *)0x0) {
    std::ios::clear(iVar2 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
  }
  else {
    sVar4 = strlen((char *)local_1f8[0]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)plVar3,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             " outValue;\n} computeSSBOValue;\n\nlayout (local_size_x = 1 ) in;\n\nvoid main(void)\n{\n    computeSSBOValue.outValue    = imageLoad( image_buffer, 0)"
             ,0x90);
  pcVar1 = (info->m_value_selector)._M_dataplus._M_p;
  local_218[0] = local_208;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_218,pcVar1,pcVar1 + (info->m_value_selector)._M_string_length);
  plVar3 = local_218[0];
  if (local_218[0] == (long *)0x0) {
    std::ios::clear(iVar2 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
  }
  else {
    sVar4 = strlen((char *)local_218[0]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)plVar3,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             ";\n    computeSSBOSize.outImageSize = imageSize( image_buffer );\n}\n",0x42);
  if (local_218[0] != local_208) {
    operator_delete(local_218[0],local_208[0] + 1);
  }
  if (local_1f8[0] != local_1e8) {
    operator_delete(local_1f8[0],local_1e8[0] + 1);
  }
  if (local_238[0] != local_228) {
    operator_delete(local_238[0],local_228[0] + 1);
  }
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0],local_1c8[0] + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string TextureBufferTextureBufferRange::getComputeShaderCode(FormatInfo& info) const
{
	std::stringstream result;

	result << "${VERSION}\n"
			  "\n"
			  "${TEXTURE_BUFFER_REQUIRE}\n"
			  "\n"
			  "precision highp float;\n"
			  "\n"
			  "layout("
		   << info.get_image_format_name().c_str() << ", binding = 0) uniform highp readonly "
		   << info.get_image_type_name().c_str() << " image_buffer;\n"
													"\n"
													"layout(binding = 0 ) buffer ComputeSSBOSize\n"
													"{\n"
													"    int outImageSize;\n"
													"} computeSSBOSize;\n"
													"layout(binding = 1 ) buffer ComputeSSBOSizeValue\n"
													"{\n"
													"    "
		   << info.get_output_type_name().c_str() << " outValue;\n"
													 "} computeSSBOValue;\n"
													 "\n"
													 "layout (local_size_x = 1 ) in;\n"
													 "\n"
													 "void main(void)\n"
													 "{\n"
													 "    computeSSBOValue.outValue    = imageLoad( image_buffer, 0)"
		   << info.get_value_selector().c_str() << ";\n"
												   "    computeSSBOSize.outImageSize = imageSize( image_buffer );\n"
												   "}\n";

	return result.str();
}